

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O1

void __thiscall Centaurus::Stage2Runner::thread_runner_impl(Stage2Runner *this)

{
  void *pvVar1;
  TransferListener p_Var2;
  uint64_t *src;
  
  this->m_current_bank = -1;
  do {
    src = (uint64_t *)acquire_bank(this);
    if (src == (uint64_t *)0x0) {
      return;
    }
    reduce_bank(this,src);
    pvVar1 = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window;
    p_Var2 = (this->super_NonRecursiveReductionRunner).m_xferlistener;
    if (p_Var2 != (TransferListener)0x0) {
      (*p_Var2)(this->m_current_bank,-1,(this->super_NonRecursiveReductionRunner).m_listener_context
               );
    }
    LOCK();
    *(undefined4 *)((long)pvVar1 + (long)this->m_current_bank * 8 + 4) = 4;
    UNLOCK();
    this->m_current_bank = -1;
  } while (src != (uint64_t *)0x0);
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    while (true) {
      uint64_t *data = reinterpret_cast<uint64_t*>(acquire_bank());
      if (data == NULL) break;
      reduce_bank(data);
      release_bank();
    }
  }